

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gia_GlaPrepareCexAndMap(Gla_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMap)

{
  Gia_Man_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Gla_Obj_t *pGVar4;
  Gla_Obj_t *pGVar5;
  Abc_Cex_t *pAVar6;
  Gia_Obj_t *pObj;
  int iVar7;
  int iVar8;
  int f;
  ulong uVar9;
  
  p_01 = Vec_IntAlloc(1000);
  for (iVar8 = 0; iVar8 < p->vAbs->nSize; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(p->vAbs,iVar8);
    pGVar4 = Gla_ManObj(p,iVar1);
    uVar2 = *(uint *)&pGVar4->field_0x4;
    if ((uVar2 & 0xa4) == 0) {
      __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                    ,0xa0,"void Gia_GlaPrepareCexAndMap(Gla_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
    }
    for (uVar9 = 0; uVar9 < uVar2 >> 9; uVar9 = uVar9 + 1) {
      pGVar5 = Gla_ManObj(p,pGVar4->Fanins[uVar9]);
      if ((pGVar5->field_0x4 & 1) == 0) {
        Vec_IntPush(p_01,pGVar5->iGiaObj);
      }
      uVar2 = *(uint *)&pGVar4->field_0x4;
    }
  }
  Vec_IntUniqify(p_01);
  iVar8 = p_01->nSize;
  iVar7 = 0;
  pAVar6 = Abc_CexAlloc(0,iVar8,p->pPars->iFrame + 1);
  iVar1 = p->pPars->iFrame;
  pAVar6->iFrame = iVar1;
  f = 0;
  do {
    if (iVar1 < f) {
      *pvMap = p_01;
      *ppCex = pAVar6;
      return;
    }
    for (iVar1 = 0; iVar1 < iVar8; iVar1 = iVar1 + 1) {
      p_00 = p->pGia;
      iVar3 = Vec_IntEntry(p_01,iVar1);
      pObj = Gia_ManObj(p_00,iVar3);
      if (pObj == (Gia_Obj_t *)0x0) break;
      iVar3 = Gia_ObjId(p->pGia,pObj);
      iVar3 = Gla_ObjSatValue(p,iVar3,f);
      if (iVar3 != 0) {
        (&pAVar6[1].iPo)[iVar7 + iVar1 >> 5] =
             (&pAVar6[1].iPo)[iVar7 + iVar1 >> 5] | 1 << ((byte)(iVar7 + iVar1) & 0x1f);
      }
    }
    f = f + 1;
    iVar1 = p->pPars->iFrame;
    iVar7 = iVar7 + iVar8;
  } while( true );
}

Assistant:

void Gia_GlaPrepareCexAndMap( Gla_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMap )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gla_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pGiaObj;
    int f, i, k;
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( vMap, pFanin->iGiaObj );
    }
    Vec_IntUniqify( vMap );
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pGiaObj, k )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pGiaObj), f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMap = vMap;
    *ppCex = pCex;
}